

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int ffedit_columns(fitsfile **fptr,char *outfile,char *expr,int *status)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  int *in_RCX;
  long in_RDX;
  char *in_RSI;
  long *in_RDI;
  int haswild;
  int delall;
  int status_del;
  int clen;
  char *clause1;
  char card [81];
  char testname [71];
  char *file_expr;
  char colformat [71];
  char oldname [71];
  char colname [71];
  char keyname [75];
  char *clause;
  char *cptr3;
  char *cptr2;
  char *cptr;
  char *tstbuff;
  int tstatus;
  int *colindex;
  int numcols;
  int savecol;
  int deletecol;
  int testnum;
  int colnum;
  int slen;
  int hdunum;
  int ii;
  fitsfile *newptr;
  int *in_stack_000005e8;
  char *in_stack_000005f0;
  fitsfile **in_stack_000005f8;
  undefined4 in_stack_fffffffffffffd38;
  int in_stack_fffffffffffffd3c;
  fitsfile *in_stack_fffffffffffffd40;
  fitsfile *in_stack_fffffffffffffd48;
  undefined1 *puVar7;
  fitsfile *in_stack_fffffffffffffd50;
  fitsfile *in_stack_fffffffffffffd58;
  int *in_stack_fffffffffffffd60;
  char *in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd70;
  int in_stack_fffffffffffffd74;
  int in_stack_fffffffffffffd78;
  int in_stack_fffffffffffffd7c;
  fitsfile *in_stack_fffffffffffffd80;
  int *in_stack_fffffffffffffd88;
  char *in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffd9c;
  fitsfile *in_stack_fffffffffffffda0;
  char **in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb4;
  fitsfile *in_stack_fffffffffffffdb8;
  int *status_00;
  char in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe39;
  char *in_stack_fffffffffffffe40;
  fitsfile *in_stack_fffffffffffffe48;
  int *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  fitsfile *in_stack_fffffffffffffe68;
  char local_178 [79];
  undefined1 uStack_129;
  char in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffed9;
  FITSfile *in_stack_fffffffffffffee0;
  int *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  fitsfile *in_stack_fffffffffffffef8;
  char *local_78;
  int *local_70;
  void *local_58;
  int local_50;
  int local_44;
  int local_40;
  int local_38;
  int local_34;
  long local_30;
  int *local_28;
  long local_20;
  long *local_10;
  int local_4;
  
  local_40 = -1;
  bVar2 = false;
  bVar1 = false;
  local_50 = 0;
  local_58 = (void *)0x0;
  status_00 = (int *)0x0;
  local_28 = in_RCX;
  local_20 = in_RDX;
  if (*in_RSI != '\0') {
    local_10 = in_RDI;
    iVar3 = ffinit(in_stack_000005f8,in_stack_000005f0,in_stack_000005e8);
    if (0 < iVar3) {
      ffpmsg((char *)0x10f94d);
      return *local_28;
    }
    ffghdn((fitsfile *)*local_10,&local_38);
    if (*(int *)(*(long *)(*local_10 + 8) + 0x1c) == 0) {
      local_34 = 1;
      while (iVar3 = ffmahd(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb4,
                            (int *)in_stack_fffffffffffffda8,&in_stack_fffffffffffffda0->HDUposition
                           ), iVar3 < 1) {
        ffcopy(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
               (int)((ulong)in_stack_fffffffffffffd48 >> 0x20),
               &in_stack_fffffffffffffd40->HDUposition);
        local_34 = local_34 + 1;
      }
      if (*local_28 == 0x6b) {
        *local_28 = 0;
      }
      else if (0 < *local_28) {
        ffclos(in_stack_fffffffffffffd48,&in_stack_fffffffffffffd40->HDUposition);
        ffpmsg((char *)0x10fa51);
        return *local_28;
      }
    }
    else {
      ffmahd(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb4,(int *)in_stack_fffffffffffffda8,
             &in_stack_fffffffffffffda0->HDUposition);
      ffcopy(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
             (int)((ulong)in_stack_fffffffffffffd48 >> 0x20),&in_stack_fffffffffffffd40->HDUposition
            );
      ffmahd(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb4,(int *)in_stack_fffffffffffffda8,
             &in_stack_fffffffffffffda0->HDUposition);
      ffcopy(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
             (int)((ulong)in_stack_fffffffffffffd48 >> 0x20),&in_stack_fffffffffffffd40->HDUposition
            );
      if (0 < *local_28) {
        ffclos(in_stack_fffffffffffffd48,&in_stack_fffffffffffffd40->HDUposition);
        ffpmsg((char *)0x10fb24);
        return *local_28;
      }
      local_38 = 2;
    }
    ffclos(in_stack_fffffffffffffd48,&in_stack_fffffffffffffd40->HDUposition);
    *local_10 = local_30;
    iVar3 = ffmahd(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb4,
                   (int *)in_stack_fffffffffffffda8,&in_stack_fffffffffffffda0->HDUposition);
    if (0 < iVar3) {
      ffpmsg((char *)0x10fba4);
      return *local_28;
    }
  }
  for (local_70 = (int *)(local_20 + 4); (char)*local_70 == ' ';
      local_70 = (int *)((long)local_70 + 1)) {
  }
  if ((char)*local_70 == '@') {
    iVar3 = ffimport_file((char *)in_stack_fffffffffffffe68,
                          (char **)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                          in_stack_fffffffffffffe58);
    local_70 = status_00;
    if (iVar3 != 0) {
      return *local_28;
    }
    for (; (char)*local_70 == ' '; local_70 = (int *)((long)local_70 + 1)) {
    }
  }
  ffgncl(in_stack_fffffffffffffd48,&in_stack_fffffffffffffd40->HDUposition,
         (int *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  iVar3 = comma2semicolon((char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  if (iVar3 == 0) {
LAB_0010fd0e:
    do {
      while( true ) {
        iVar3 = fits_get_token2((char **)in_stack_fffffffffffffdb8,
                                (char *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0
                                                ),in_stack_fffffffffffffda8,
                                &in_stack_fffffffffffffda0->HDUposition,
                                (int *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98)
                               );
        if (iVar3 < 1) {
          if ((bVar1) && (!bVar2)) {
            for (local_34 = local_50; 0 < local_34; local_34 = local_34 + -1) {
              if ((*(int *)((long)local_58 + (long)(local_34 + -1) * 4) == 0) &&
                 (iVar3 = ffdcol(in_stack_fffffffffffffe68,in_stack_fffffffffffffe64,
                                 in_stack_fffffffffffffe58), 0 < iVar3)) {
                ffpmsg((char *)0x1112e1);
                ffpmsg((char *)0x1112ee);
                if (local_58 != (void *)0x0) {
                  free(local_58);
                }
                if (status_00 != (int *)0x0) {
                  free(status_00);
                }
                return *local_28;
              }
            }
          }
          if (local_58 != (void *)0x0) {
            free(local_58);
          }
          if (status_00 != (int *)0x0) {
            free(status_00);
          }
          return *local_28;
        }
        if ((char)*local_70 == ';') {
          local_70 = (int *)((long)local_70 + 1);
        }
        *(undefined1 *)(long)iVar3 = 0;
        if ((cRam0000000000000000 != '!') && (cRam0000000000000000 != '-')) break;
        in_stack_fffffffffffffd80 = (fitsfile *)&cRam0000000000000001;
        if (cRam0000000000000001 == '\0') {
          in_stack_fffffffffffffd68 = (char *)0x0;
        }
        else {
          in_stack_fffffffffffffd68 = (char *)strlen(&cRam0000000000000001);
        }
        in_stack_fffffffffffffd7c = (int)in_stack_fffffffffffffd68;
        if ((((*local_28 == 0) && (1 < in_stack_fffffffffffffd7c)) &&
            ((char)in_stack_fffffffffffffd80->HDUposition != '#')) &&
           (*(char *)((long)&in_stack_fffffffffffffd80->HDUposition +
                     (long)(in_stack_fffffffffffffd7c + -1)) == '+')) {
          *(undefined1 *)
           ((long)&in_stack_fffffffffffffd80->HDUposition + (long)(in_stack_fffffffffffffd7c + -1))
               = 0;
          in_stack_fffffffffffffd7c = in_stack_fffffffffffffd7c + -1;
          do {
            in_stack_fffffffffffffd78 = 0;
            *local_28 = 0;
            ffgcno(in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,in_stack_fffffffffffffd90,
                   in_stack_fffffffffffffd88,&in_stack_fffffffffffffd80->HDUposition);
            if ((*local_28 != 0) && (*local_28 != 0xed)) break;
            iVar3 = ffdcol(in_stack_fffffffffffffe68,in_stack_fffffffffffffe64,
                           in_stack_fffffffffffffe58);
            if (0 < iVar3) {
              ffpmsg((char *)0x10fed6);
              ffpmsg((char *)0x10fee3);
              if (local_58 != (void *)0x0) {
                free(local_58);
              }
              if (status_00 != (int *)0x0) {
                free(status_00);
              }
              *local_28 = in_stack_fffffffffffffd78;
              return in_stack_fffffffffffffd78;
            }
            bVar2 = true;
            local_50 = local_50 + -1;
          } while (*local_28 == 0xed);
          *local_28 = 0;
          local_40 = -1;
        }
        else if ((((char)in_stack_fffffffffffffd80->HDUposition == '\0') ||
                 ((char)in_stack_fffffffffffffd80->HDUposition == '#')) ||
                ((iVar3 = ffgcno(in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,
                                 in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                                 &in_stack_fffffffffffffd80->HDUposition), 0 < iVar3 &&
                 (*local_28 != 0xed)))) {
          iVar3 = 0;
          in_stack_fffffffffffffd70 = 0;
          ffcmsg();
          *local_28 = 0;
          if ((char)in_stack_fffffffffffffd80->HDUposition == '#') {
            in_stack_fffffffffffffd80 =
                 (fitsfile *)((long)&in_stack_fffffffffffffd80->HDUposition + 1);
          }
          sVar5 = strlen((char *)in_stack_fffffffffffffd80);
          in_stack_fffffffffffffd7c = (int)sVar5;
          if ((1 < in_stack_fffffffffffffd7c) &&
             (*(char *)((long)&in_stack_fffffffffffffd80->HDUposition +
                       (long)(in_stack_fffffffffffffd7c + -1)) == '+')) {
            iVar3 = 1;
            *(undefined1 *)
             ((long)&in_stack_fffffffffffffd80->HDUposition + (long)(in_stack_fffffffffffffd7c + -1)
             ) = 0;
          }
          pcVar6 = strchr((char *)in_stack_fffffffffffffd80,0x3f);
          if (((pcVar6 != (char *)0x0) ||
              (pcVar6 = strchr((char *)in_stack_fffffffffffffd80,0x2a), pcVar6 != (char *)0x0)) ||
             (pcVar6 = strchr((char *)in_stack_fffffffffffffd80,0x23), pcVar6 != (char *)0x0)) {
            in_stack_fffffffffffffd70 = 1;
          }
          if (in_stack_fffffffffffffd70 != 0) {
            ffmaky(in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c,(int *)0x1101bb);
          }
          do {
            iVar4 = ffdkey(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                           in_stack_fffffffffffffee8);
            if (0 < iVar4) {
              if ((iVar3 == 0) || (*local_28 != 0xca)) {
                ffpmsg((char *)0x110223);
                ffpmsg((char *)0x11022d);
                if (local_58 != (void *)0x0) {
                  free(local_58);
                }
                if (status_00 != (int *)0x0) {
                  free(status_00);
                }
                return *local_28;
              }
              ffcmsg();
              *local_28 = 0;
              iVar3 = 0;
            }
          } while (iVar3 != 0);
          in_stack_fffffffffffffd74 = 0;
        }
        else {
          *local_28 = 0;
          iVar3 = ffdcol(in_stack_fffffffffffffe68,in_stack_fffffffffffffe64,
                         in_stack_fffffffffffffe58);
          if (0 < iVar3) {
            ffpmsg((char *)0x110033);
            ffpmsg((char *)0x110040);
            if (local_58 != (void *)0x0) {
              free(local_58);
            }
            if (status_00 != (int *)0x0) {
              free(status_00);
            }
            return *local_28;
          }
          bVar2 = true;
          local_50 = local_50 + -1;
          local_40 = -1;
        }
      }
      local_78 = (char *)0x0;
      iVar3 = fits_get_token2((char **)in_stack_fffffffffffffdb8,
                              (char *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                              in_stack_fffffffffffffda8,&in_stack_fffffffffffffda0->HDUposition,
                              (int *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      if ((iVar3 == 0) || (*local_28 != 0)) {
        ffpmsg((char *)0x110309);
        ffpmsg((char *)0x110316);
        if (local_58 != (void *)0x0) {
          free(local_58);
        }
        if (status_00 != (int *)0x0) {
          free(status_00);
        }
        if (*local_28 == 0) {
          *local_28 = 0x7d;
        }
        return *local_28;
      }
      sVar5 = strlen((char *)0x0);
      if (0x46 < sVar5) {
        ffpmsg((char *)0x1103b2);
        ffpmsg((char *)0x1103bf);
        if (local_58 != (void *)0x0) {
          free(local_58);
        }
        if (status_00 != (int *)0x0) {
          free(status_00);
        }
        free((void *)0x0);
        *local_28 = 0x7d;
        return 0x7d;
      }
      strcpy(&stack0xfffffffffffffed8,(char *)0x0);
      free((void *)0x0);
      if (in_stack_fffffffffffffed8 == '#') {
        in_stack_fffffffffffffd60 = (int *)strstr(&stack0xfffffffffffffed9,"#");
        in_stack_fffffffffffffd58 = (fitsfile *)&stack0xfffffffffffffed8;
        sVar5 = strlen(&stack0xfffffffffffffed8);
        if (in_stack_fffffffffffffd60 != (int *)((long)in_stack_fffffffffffffd58 + (sVar5 - 1)))
        goto LAB_001105d0;
        if (local_40 < 1) {
          ffpmsg((char *)0x1104db);
          ffpmsg((char *)0x1104e8);
          ffpmsg((char *)0x1104f4);
          ffpmsg((char *)0x110500);
          if (status_00 != (int *)0x0) {
            free(status_00);
          }
          *local_28 = 0x7d;
          return 0x7d;
        }
        sVar5 = strlen(&stack0xfffffffffffffed8);
        (&uStack_129)[sVar5] = 0;
        ffkeyn((char *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
               in_stack_fffffffffffffd74,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
        if (*local_28 != 0) {
          return *local_28;
        }
        strcpy(&stack0xfffffffffffffed9,local_178);
      }
      else {
LAB_001105d0:
        pcVar6 = strstr(&stack0xfffffffffffffed8,"#");
        puVar7 = &stack0xfffffffffffffed8;
        sVar5 = strlen(&stack0xfffffffffffffed8);
        if ((pcVar6 == puVar7 + (sVar5 - 1)) && (0 < local_40)) {
          ffgcno(in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,in_stack_fffffffffffffd90,
                 in_stack_fffffffffffffd88,&in_stack_fffffffffffffd80->HDUposition);
        }
      }
      if (cRam0000000000000000 == '(') {
        iVar3 = fits_get_token2((char **)in_stack_fffffffffffffdb8,
                                (char *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0
                                                ),in_stack_fffffffffffffda8,
                                &in_stack_fffffffffffffda0->HDUposition,
                                (int *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98)
                               );
        if (iVar3 == 0) {
          strcat(&stack0xfffffffffffffed8,")");
        }
        else {
          in_stack_fffffffffffffd40 = (fitsfile *)strlen((char *)0x0);
          sVar5 = strlen(&stack0xfffffffffffffed8);
          if (0x46 < (long)&in_stack_fffffffffffffd40->HDUposition + sVar5 + 1) {
            ffpmsg((char *)0x110818);
            if (status_00 != (int *)0x0) {
              free(status_00);
            }
            free((void *)0x0);
            *local_28 = 0x7d;
            return *local_28;
          }
          strcat(&stack0xfffffffffffffed8,(char *)0x0);
          strcat(&stack0xfffffffffffffed8,")");
          free((void *)0x0);
        }
        local_78 = &cRam0000000000000001;
      }
      for (; *local_78 == ' '; local_78 = local_78 + 1) {
      }
      if (*local_78 != '=') {
        ffgcno(in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,in_stack_fffffffffffffd90,
               in_stack_fffffffffffffd88,&in_stack_fffffffffffffd80->HDUposition);
        while (*local_28 == 0xed) {
          local_40 = local_44;
          bVar1 = true;
          if (local_58 == (void *)0x0) {
            local_58 = calloc(999,4);
          }
          *(undefined4 *)((long)local_58 + (long)(local_44 + -1) * 4) = 1;
          ffgcno(in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,in_stack_fffffffffffffd90,
                 in_stack_fffffffffffffd88,&in_stack_fffffffffffffd80->HDUposition);
          if (*local_28 == 0xdb) {
            *local_28 = 999;
          }
        }
        if (*local_28 < 1) {
          local_40 = local_44;
          bVar1 = true;
          if (local_58 == (void *)0x0) {
            local_58 = calloc(999,4);
          }
          *(undefined4 *)((long)local_58 + (long)(local_44 + -1) * 4) = 1;
        }
        else {
          if (*local_28 != 999) {
            ffpmsg((char *)0x110a82);
            ffpmsg((char *)0x110a8f);
            if (local_58 != (void *)0x0) {
              free(local_58);
            }
            if (status_00 != (int *)0x0) {
              free(status_00);
            }
            *local_28 = 0x7d;
            return 0x7d;
          }
          *local_28 = 0;
        }
        goto LAB_0010fd0e;
      }
      if (local_78[1] != '=') {
        in_stack_fffffffffffffe38 = '\0';
        iVar3 = fits_get_token2((char **)in_stack_fffffffffffffdb8,
                                (char *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0
                                                ),in_stack_fffffffffffffda8,
                                &in_stack_fffffffffffffda0->HDUposition,
                                (int *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98)
                               );
        if (iVar3 == 0) {
          local_178[0] = '\0';
        }
        else {
          sVar5 = strlen((char *)0x0);
          if (0x46 < sVar5) {
            ffpmsg((char *)0x110eee);
            if (local_58 != (void *)0x0) {
              free(local_58);
            }
            if (status_00 != (int *)0x0) {
              free(status_00);
            }
            free((void *)0x0);
            *local_28 = 0x7d;
            return *local_28;
          }
          strcpy(local_178,(char *)0x0);
          free((void *)0x0);
        }
        if (in_stack_fffffffffffffed8 == '(') {
          iVar3 = fits_get_token2((char **)in_stack_fffffffffffffdb8,
                                  (char *)CONCAT44(in_stack_fffffffffffffdb4,
                                                   in_stack_fffffffffffffdb0),
                                  in_stack_fffffffffffffda8,&in_stack_fffffffffffffda0->HDUposition,
                                  (int *)CONCAT44(in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98));
          if (iVar3 == 0) {
            in_stack_fffffffffffffe38 = '\0';
          }
          else {
            sVar5 = strlen((char *)0x0);
            if (0x46 < sVar5) {
              ffpmsg((char *)0x11101a);
              if (local_58 != (void *)0x0) {
                free(local_58);
              }
              if (status_00 != (int *)0x0) {
                free(status_00);
              }
              free((void *)0x0);
              *local_28 = 0x7d;
              return *local_28;
            }
            strcpy(&stack0xfffffffffffffe38,(char *)0x0);
            free((void *)0x0);
          }
        }
        iVar3 = ffcalc(in_stack_fffffffffffffd80,
                       (char *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                       (fitsfile *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                       in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60,
                       &in_stack_fffffffffffffd58->HDUposition);
        if (0 < iVar3) {
          ffpmsg((char *)0x11110f);
          if (local_58 != (void *)0x0) {
            free(local_58);
          }
          if (status_00 != (int *)0x0) {
            free(status_00);
          }
          return *local_28;
        }
        ffgcno(in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,in_stack_fffffffffffffd90,
               in_stack_fffffffffffffd88,&in_stack_fffffffffffffd80->HDUposition);
        if (local_58 == (void *)0x0) {
          local_58 = calloc(999,4);
        }
        *(undefined4 *)((long)local_58 + (long)(local_44 + -1) * 4) = 1;
        if (local_50 < local_44) {
          local_50 = local_50 + 1;
        }
        local_40 = local_44;
        bVar1 = true;
        goto LAB_0010fd0e;
      }
      for (local_78 = local_78 + 2; *local_78 == ' '; local_78 = local_78 + 1) {
      }
      iVar3 = fits_get_token2((char **)in_stack_fffffffffffffdb8,
                              (char *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                              in_stack_fffffffffffffda8,&in_stack_fffffffffffffda0->HDUposition,
                              (int *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      if (iVar3 == 0) {
        local_178[0] = '\0';
      }
      else {
        sVar5 = strlen((char *)0x0);
        if (0x46 < sVar5) {
          ffpmsg((char *)0x110bb7);
          if (status_00 != (int *)0x0) {
            free(status_00);
          }
          free((void *)0x0);
          *local_28 = 0x7d;
          return *local_28;
        }
        strcpy(local_178,(char *)0x0);
        free((void *)0x0);
      }
      iVar3 = ffgcno(in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,in_stack_fffffffffffffd90,
                     in_stack_fffffffffffffd88,&in_stack_fffffffffffffd80->HDUposition);
      if (iVar3 < 1) {
        ffkeyn((char *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
               in_stack_fffffffffffffd74,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
        iVar3 = ffmkys(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                       (char *)in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0,
                       (int *)CONCAT71(in_stack_fffffffffffffed9,in_stack_fffffffffffffed8));
        if (0 < iVar3) {
          ffpmsg((char *)0x110cdd);
          ffpmsg((char *)0x110ce9);
          ffpmsg((char *)0x110cf6);
          ffpmsg((char *)0x110d02);
          ffpmsg((char *)0x110d0f);
          if (local_58 != (void *)0x0) {
            free(local_58);
          }
          if (status_00 != (int *)0x0) {
            free(status_00);
          }
          return *local_28;
        }
        bVar1 = true;
        if (local_58 == (void *)0x0) {
          local_58 = calloc(999,4);
        }
        *(undefined4 *)((long)local_58 + (long)(local_40 + -1) * 4) = 1;
        goto LAB_0010fd0e;
      }
      ffcmsg();
      *local_28 = 0;
      iVar3 = ffmnam(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                     (char *)CONCAT71(in_stack_fffffffffffffe39,in_stack_fffffffffffffe38),status_00
                    );
    } while (iVar3 < 1);
    ffpmsg((char *)0x110e07);
    ffpmsg((char *)0x110e14);
    if (local_58 != (void *)0x0) {
      free(local_58);
    }
    if (status_00 != (int *)0x0) {
      free(status_00);
    }
    local_4 = *local_28;
  }
  else {
    ffpmsg((char *)0x10fcc3);
    ffpmsg((char *)0x10fcd0);
    if (status_00 != (int *)0x0) {
      free(status_00);
    }
    *local_28 = 0x1af;
    local_4 = *local_28;
  }
  return local_4;
}

Assistant:

int ffedit_columns(
           fitsfile **fptr,  /* IO - pointer to input table; on output it  */
                             /*      points to the new selected rows table */
           char *outfile,    /* I - name for output file */
           char *expr,       /* I - column edit expression    */
           int *status)
/*
   modify columns in a table and/or header keywords in the HDU
*/
{
    fitsfile *newptr;
    int ii, hdunum, slen, colnum = -1, testnum, deletecol = 0, savecol = 0;
    int numcols = 0, *colindex = 0, tstatus = 0;
    char *tstbuff=0, *cptr, *cptr2, *cptr3, *clause = NULL, keyname[FLEN_KEYWORD];
    char colname[FLEN_VALUE], oldname[FLEN_VALUE], colformat[FLEN_VALUE];
    char *file_expr = NULL, testname[FLEN_VALUE], card[FLEN_CARD];

    if (*outfile)
    {
      /* create new empty file in to hold the selected rows */
      if (ffinit(&newptr, outfile, status) > 0)
      {
        ffpmsg("failed to create file for copy (ffedit_columns)");
        return(*status);
      }

      fits_get_hdu_num(*fptr, &hdunum);  /* current HDU number in input file */

      /* copy all HDUs to the output copy, if the 'only_one' flag is not set */
      if (!((*fptr)->Fptr)->only_one) {
        for (ii = 1; 1; ii++)
        {
          if (fits_movabs_hdu(*fptr, ii, NULL, status) > 0)
            break;

          fits_copy_hdu(*fptr, newptr, 0, status);
        }

        if (*status == END_OF_FILE)
        {
          *status = 0;              /* got the expected EOF error; reset = 0  */
        }
        else if (*status > 0)
        {
          ffclos(newptr, status);
          ffpmsg("failed to copy all HDUs from input file (ffedit_columns)");
          return(*status);
        }


      } else {
        /* only copy the primary array and the designated table extension */
	fits_movabs_hdu(*fptr, 1, NULL, status);
	fits_copy_hdu(*fptr, newptr, 0, status);
	fits_movabs_hdu(*fptr, hdunum, NULL, status);
	fits_copy_hdu(*fptr, newptr, 0, status);
        if (*status > 0)
        {
          ffclos(newptr, status);
          ffpmsg("failed to copy all HDUs from input file (ffedit_columns)");
          return(*status);
        }
        hdunum = 2;
      }

      /* close the original file and return ptr to the new image */
      ffclos(*fptr, status);

      *fptr = newptr; /* reset the pointer to the new table */

      /* move back to the selected table HDU */
      if (fits_movabs_hdu(*fptr, hdunum, NULL, status) > 0)
      {
         ffpmsg("failed to copy the input file (ffedit_columns)");
         return(*status);
      }
    }

    /* remove the "col " from the beginning of the column edit expression */
    cptr = expr + 4;

    while (*cptr == ' ')
         cptr++;         /* skip leading white space */
   
    /* Check if need to import expression from a file */

    if( *cptr=='@' ) {
       if( ffimport_file( cptr+1, &file_expr, status ) ) return(*status);
       cptr = file_expr;
       while (*cptr == ' ')
          cptr++;         /* skip leading white space... again */
    }

    tstatus = 0;
    ffgncl(*fptr, &numcols, &tstatus);  /* get initial # of cols */

    /* as of July 2012, the CFITSIO column filter syntax was modified */
    /* so that commas may be used to separate clauses, as well as semi-colons. */
    /* This was done because users cannot enter the semi-colon in the HEASARC's */
    /* Hera on-line data processing system for computer security reasons.  */
    /* Therefore, we must convert those commas back to semi-colons here, but we */
    /* must not convert any columns that occur within parenthesies.  */

    if (comma2semicolon(cptr)) {
         ffpmsg("parsing error in column filter expression");
         ffpmsg(cptr);
         if( file_expr ) free( file_expr );
         *status = PARSE_SYNTAX_ERR;
         return(*status);
    }

    /* parse expression and get first clause, if more than 1 */
    while ((slen = fits_get_token2(&cptr, ";", &clause, NULL, status)) > 0 )
    {
        if( *cptr==';' ) cptr++;
        clause[slen] = '\0';

        if (clause[0] == '!' || clause[0] == '-')
        {
	    char *clause1 = clause+1;
	    int clen = clause1[0] ? strlen(clause1) : 0;
            /* ===================================== */
            /* Case I. delete this column or keyword */
            /* ===================================== */

	    /* Case Ia. delete column names with 0-or-more wildcard
	            -COLNAME+ - delete repeated columns with exact name
		    -COLNAM*+ - delete columns matching patterns
	    */
	    if (*status == 0 &&
		clen > 1 && clause1[0] != '#' &&
		clause1[clen-1] == '+') {

	      clause1[clen-1] = 0; clen--;

	      /* Note that this is a delete 0 or more specification,
		 which means that no matching columns is not an error. */
	      do {
		int status_del = 0;

		/* Have to set status=0 so we can reset the search at
		   start column.  Because we are deleting columns on
		   the fly here, we have to reset the search every
		   time. The only penalty here is execution time
		   because leaving *status == COL_NOT_UNIQUE is merely
		   an optimization for tables assuming the tables do
		   not change from one call to the next. (an
		   assumption broken in this loop) */
		*status = 0; 
		ffgcno(*fptr, CASEINSEN, clause1, &colnum, status);
		/* ffgcno returns COL_NOT_UNIQUE if there are multiple columns,
		   and COL_NOT_FOUND after the last column is found, and 
		   COL_NOT_FOUND if no matches were found */
		if (*status != 0 && *status != COL_NOT_UNIQUE) break;
		
                if (ffdcol(*fptr, colnum, &status_del) > 0) {
		  ffpmsg("failed to delete column in input file:");
		  ffpmsg(clause);
		  if( colindex ) free( colindex );
		  if( file_expr ) free( file_expr );
		  if( clause ) free(clause);
		  return (*status = status_del);
		}
                deletecol = 1; /* set flag that at least one col was deleted */
                numcols--;
	      } while (*status == COL_NOT_UNIQUE);

	      *status = 0; /* No matches are still successful */
	      colnum = -1; /* Ignore the column we found */

	    /* Case Ib. delete column names with wildcard or not
	            -COLNAME  - deleted exact column
		    -COLNAM*  - delete first column that matches pattern
	       Note no leading '#'
	    */
	    } else if (clause1[0] && clause1[0] != '#' &&
		       ((ffgcno(*fptr, CASEINSEN, clause1, &colnum, status) <= 0) ||
			*status == COL_NOT_UNIQUE))
            {
                /* a column with this name exists, so try to delete it */
	        *status = 0; /* Clear potential status=COL_NOT_UNIQUE */
                if (ffdcol(*fptr, colnum, status) > 0)
                {
                    ffpmsg("failed to delete column in input file:");
                    ffpmsg(clause);
                    if( colindex ) free( colindex );
                    if( file_expr ) free( file_expr );
		    if( clause ) free(clause);
                    return(*status);
                }
                deletecol = 1; /* set flag that at least one col was deleted */
                numcols--;
                colnum = -1;
            }
	    /* Case Ic. delete keyword(s)
	            -KEYNAME,#KEYNAME  - delete exact keyword (first match)
		    -KEYNAM*,#KEYNAM*  - delete first matching keyword
		    -KEYNAME+,-#KEYNAME+ - delete 0-or-more exact matches of exact keyword
		    -KEYNAM*+,-#KEYNAM*+ - delete 0-or-more wildcard matches 
	       Note the preceding # is optional if no conflicting column name exists
	       and that wildcard patterns are described in "colfilter" section of
	       documentation.
	    */
            else
            {
	      int delall = 0;
	      int haswild = 0;
	        ffcmsg();   /* clear previous error message from ffgcno */
                /* try deleting a keyword with this name */
                *status = 0;
		/* skip past leading '#' if any */
		if (clause1[0] == '#') clause1++;
		clen = strlen(clause1);

		/* Repeat deletion of keyword if requested with trailing '+' */
		if (clen > 1 && clause1[clen-1] == '+') {
		  delall = 1;
		  clause1[clen-1] = 0;
		}
		/* Determine if this pattern has wildcards */
		if (strchr(clause1,'?') || strchr(clause1,'*') || strchr(clause1,'#')) {
		  haswild = 1;
		}

		if (haswild) {
		  /* ffdkey() behaves differently if the pattern has a wildcard:
		     it only checks from the "current" header position to the end, and doesn't
		     check before the "current" header position.  Therefore, for the
		     case of wildcards we will have to reset to the beginning. */
		  ffmaky(*fptr, 1, status);  /* reset pointer to beginning of header */
		}

		/* Single or repeated deletions until done */
		do {
		  if (ffdkey(*fptr, clause1, status) > 0)
		    {
		      if (delall && *status == KEY_NO_EXIST) {
			/* Found last wildcard item. Stop deleting */
			ffcmsg();
			*status = 0;
			delall = 0; /* Force end of this loop */
		      } else {
			/* This was not a wildcard deletion, or it resulted in
			   another kind of error */
			ffpmsg("column or keyword to be deleted does not exist:");
			ffpmsg(clause1);
			if( colindex ) free( colindex );
			if( file_expr ) free( file_expr );
			if( clause ) free(clause);
			return(*status);
		      }
		    }
		} while(delall); /* end do{} */
            }
        }
        else
        {
            /* ===================================================== */
            /* Case II:
	       this is either a column name, (case 1) 

               or a new column name followed by double = ("==") followed
               by the old name which is to be renamed. (case 2A)

               or a column or keyword name followed by a single "=" and a
	       calculation expression (case 2B) */
            /* ===================================================== */
            cptr2 = clause;
            slen = fits_get_token2(&cptr2, "( =", &tstbuff, NULL, status);

            if (slen == 0 || *status)
            {
                ffpmsg("error: column or keyword name is blank (ffedit_columns):");
                ffpmsg(clause);
                if( colindex ) free( colindex );
                if( file_expr ) free( file_expr );
		if (clause) free(clause);
                if (*status==0)
                   *status=URL_PARSE_ERROR;
                return(*status);
            }
            if (strlen(tstbuff) > FLEN_VALUE-1)
            {
                ffpmsg("error: column or keyword name is too long (ffedit_columns):");
                ffpmsg(clause);
                if( colindex ) free( colindex );
                if( file_expr ) free( file_expr );
		if (clause) free(clause);
                free(tstbuff);
                return(*status= URL_PARSE_ERROR);
            }
            strcpy(colname, tstbuff);
            free(tstbuff);
            tstbuff=0;

	    /* If this is a keyword of the form 
	         #KEYWORD# 
	       then transform to the form
	         #KEYWORDn
	       where n is the previously used column number 
	    */
	    if (colname[0] == '#' &&
		strstr(colname+1, "#") == (colname + strlen(colname) - 1)) 
	    {
		if (colnum <= 0) 
		  {
		    ffpmsg("The keyword name:");
		    ffpmsg(colname);
		    ffpmsg("is invalid unless a column has been previously");
		    ffpmsg("created or editted by a calculator command");
                    if( file_expr ) free( file_expr );
		    if (clause) free(clause);
		    return(*status = URL_PARSE_ERROR);
		  }
		colname[strlen(colname)-1] = '\0';
		/* Make keyword name and put it in oldname */
		ffkeyn(colname+1, colnum, oldname, status);
		if (*status) return (*status);
		/* Re-copy back into colname */
		strcpy(colname+1,oldname);
	    }
            else if  (strstr(colname, "#") == (colname + strlen(colname) - 1)) 
	    {
	        /*  colname is of the form "NAME#";  if
		      a) colnum is defined, and
		      b) a column with literal name "NAME#" does not exist, and
		      c) a keyword with name "NAMEn" (where n=colnum) exists, then
		    transfrom the colname string to "NAMEn", otherwise
		    do nothing.
		*/
		if (colnum > 0) {  /* colnum must be defined */
		  tstatus = 0;
                  ffgcno(*fptr, CASEINSEN, colname, &testnum, &tstatus);
		  if (tstatus != 0 && tstatus != COL_NOT_UNIQUE) 
		  {  
		    /* OK, column doesn't exist, now see if keyword exists */
		    ffcmsg();   /* clear previous error message from ffgcno */
		    strcpy(testname, colname);
 		    testname[strlen(testname)-1] = '\0';
		    /* Make keyword name and put it in oldname */
		    ffkeyn(testname, colnum, oldname, status);
		    if (*status) {
                      if( file_expr ) free( file_expr );
		      if (clause) free(clause);
		      return (*status);
		    }

		    tstatus = 0;
		    if (!fits_read_card(*fptr, oldname, card, &tstatus)) {
		      /* Keyword does exist; copy real name back into colname */
		      strcpy(colname,oldname);
		    }
		  }
                }
	    }

            /* if we encountered an opening parenthesis, then we need to */
            /* find the closing parenthesis, and concatinate the 2 strings */
            /* This supports expressions like:
                [col #EXTNAME(Extension name)="GTI"]
            */
            if (*cptr2  == '(')
            {
                if (fits_get_token2(&cptr2, ")", &tstbuff, NULL, status)==0)
                {
                   strcat(colname,")");
                }
                else
                {
                   if ((strlen(tstbuff) + strlen(colname) + 1) >
                        FLEN_VALUE-1)
                   {
                      ffpmsg("error: column name is too long (ffedit_columns):");
                      if( file_expr ) free( file_expr );
		      if (clause) free(clause);
                      free(tstbuff);
                      *status=URL_PARSE_ERROR;
		      return (*status);
                   }
                   strcat(colname, tstbuff);
                   strcat(colname, ")");
                   free(tstbuff);
                   tstbuff=0;
                }
                cptr2++;
            }

            while (*cptr2 == ' ')
                 cptr2++;         /* skip white space */

            if (*cptr2 != '=')
            {
              /* ------------------------------------ */
              /* case 1 - simply the name of a column */
              /* ------------------------------------ */

              /* look for matching column */
              ffgcno(*fptr, CASEINSEN, colname, &testnum, status);
	      
              while (*status == COL_NOT_UNIQUE) 
              {
                 /* the column name contained wild cards, and it */
                 /* matches more than one column in the table. */
		 
		 colnum = testnum;

                 /* keep this column in the output file */
                 savecol = 1;

                 if (!colindex)
                    colindex = (int *) calloc(999, sizeof(int));

                 colindex[colnum - 1] = 1;  /* flag this column number */

                 /* look for other matching column names */
                 ffgcno(*fptr, CASEINSEN, colname, &testnum, status);

                 if (*status == COL_NOT_FOUND)
                    *status = 999;  /* temporary status flag value */
              }

              if (*status <= 0)
              {
	         colnum = testnum;
		 
                 /* keep this column in the output file */
                 savecol = 1;

                 if (!colindex)
                    colindex = (int *) calloc(999, sizeof(int));

                 colindex[colnum - 1] = 1;  /* flag this column number */
              }
              else if (*status == 999)
              {
                  /* this special flag value does not represent an error */
                  *status = 0;  
              }
              else
              {
               ffpmsg("Syntax error in columns specifier in input URL:");
               ffpmsg(cptr2);
               if( colindex ) free( colindex );
               if( file_expr ) free( file_expr );
	       if (clause) free(clause);
               return(*status = URL_PARSE_ERROR);
              }
            }
            else
            {
              /* ----------------------------------------------- */
              /* case 2 where the token ends with an equals sign */
              /* ----------------------------------------------- */

              cptr2++;   /* skip over the first '=' */

              if (*cptr2 == '=')
              {
                /*................................................. */
                /*  Case A:  rename a column or keyword;  syntax is
                    "new_name == old_name"  */
                /*................................................. */

                cptr2++;  /* skip the 2nd '=' */
                while (*cptr2 == ' ')
                      cptr2++;       /* skip white space */

                if (fits_get_token2(&cptr2, " ", &tstbuff, NULL, status)==0)
                {
                   oldname[0]=0;
                }
                else
                {
                   if (strlen(tstbuff) > FLEN_VALUE-1)
                   {
                      ffpmsg("error: column name syntax is too long (ffedit_columns):");
                      if( file_expr ) free( file_expr );
		      if (clause) free(clause);
                      free(tstbuff);
                      *status=URL_PARSE_ERROR;
		      return (*status);
                   }
                   strcpy(oldname, tstbuff);
                   free(tstbuff);
                   tstbuff=0;
                }
                /* get column number of the existing column */
                if (ffgcno(*fptr, CASEINSEN, oldname, &colnum, status) <= 0)
                {
                    /* modify the TTYPEn keyword value with the new name */
                    ffkeyn("TTYPE", colnum, keyname, status);

                    if (ffmkys(*fptr, keyname, colname, NULL, status) > 0)
                    {
                      ffpmsg("failed to rename column in input file");
                      ffpmsg(" oldname =");
                      ffpmsg(oldname);
                      ffpmsg(" newname =");
                      ffpmsg(colname);
                      if( colindex ) free( colindex );
                      if( file_expr ) free( file_expr );
	              if (clause) free(clause);
                      return(*status);
                    }
                    /* keep this column in the output file */
                    savecol = 1;
                    if (!colindex)
                       colindex = (int *) calloc(999, sizeof(int));

                    colindex[colnum - 1] = 1;  /* flag this column number */
                }
                else
                {
                    /* try renaming a keyword */
		    ffcmsg();   /* clear error message stack */
                    *status = 0;
                    if (ffmnam(*fptr, oldname, colname, status) > 0)
                    {
                      ffpmsg("column or keyword to be renamed does not exist:");
                        ffpmsg(clause);
                        if( colindex ) free( colindex );
                        if( file_expr ) free( file_expr );
			if (clause) free(clause);
                        return(*status);
                    }
                }
              }  
              else
              {
                /*...................................................... */
                /* Case B: */
                /* this must be a general column/keyword calc expression */
                /* "name = expression" or "colname(TFORM) = expression" */
                /*...................................................... */

                /* parse the name and TFORM values, if present */
                colformat[0] = '\0';
                cptr3 = colname;

                if (fits_get_token2(&cptr3, "(", &tstbuff, NULL, status)==0)
                {
                   oldname[0]=0;
                }
                else
                {
                   if (strlen(tstbuff) > FLEN_VALUE-1)
                   {
                         ffpmsg("column expression is too long (ffedit_columns)");
                         if( colindex ) free( colindex );
                         if( file_expr ) free( file_expr );
		         if (clause) free(clause);
                         free(tstbuff);
                         *status=URL_PARSE_ERROR;
                         return(*status);
                   }
                   strcpy(oldname, tstbuff);
                   free(tstbuff);
                   tstbuff=0;
                }
                if (cptr3[0] == '(' )
                {
                   cptr3++;  /* skip the '(' */
                   if (fits_get_token2(&cptr3, ")", &tstbuff, NULL, status)==0)
                   {
                      colformat[0]=0;
                   }
                   else
                   {
                      if (strlen(tstbuff) > FLEN_VALUE-1)
                      {
                            ffpmsg("column expression is too long (ffedit_columns)");
                            if( colindex ) free( colindex );
                            if( file_expr ) free( file_expr );
		            if (clause) free(clause);
                            free(tstbuff);
                            *status=URL_PARSE_ERROR;
                            return(*status);
                      }
                      strcpy(colformat, tstbuff);
                      free(tstbuff);
                      tstbuff=0;
                   }
                }

                /* calculate values for the column or keyword */
                /*   cptr2 = the expression to be calculated */
                /*   oldname = name of the column or keyword */
                /*   colformat = column format, or keyword comment string */
                if (fits_calculator(*fptr, cptr2, *fptr, oldname, colformat,
       	                        status) > 0) {
				
                        ffpmsg("Unable to calculate expression");
                        if( colindex ) free( colindex );
                        if( file_expr ) free( file_expr );
			if (clause) free(clause);
                         return(*status);
                }

                /* test if this is a column and not a keyword */
                tstatus = 0;
                ffgcno(*fptr, CASEINSEN, oldname, &testnum, &tstatus);
                if (tstatus == 0)
                {
                    /* keep this column in the output file */
		    colnum = testnum;
                    savecol = 1;

                    if (!colindex)
                      colindex = (int *) calloc(999, sizeof(int));

                    colindex[colnum - 1] = 1;
                    if (colnum > numcols)numcols++;
                }
		else
		{
		   ffcmsg();  /* clear the error message stack */
		}
              }
            }
        }
	if (clause) free(clause);  /* free old clause before getting new one */
        clause = NULL;
    }

    if (savecol && !deletecol)
    {
       /* need to delete all but the specified columns */
       for (ii = numcols; ii > 0; ii--)
       {
         if (!colindex[ii-1])  /* delete this column */
         {
           if (ffdcol(*fptr, ii, status) > 0)
           {
             ffpmsg("failed to delete column in input file:");
             ffpmsg(clause);
             if( colindex ) free( colindex );
             if( file_expr ) free( file_expr );
	     if (clause) free(clause);
             return(*status);
           }
         }
       }
    }

    if( colindex ) free( colindex );
    if( file_expr ) free( file_expr );
    if (clause) free(clause);

    return(*status);
}